

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void idx2::IncreaseCapacity<unsigned_long,idx2::chunk_cache>
               (hash_table<unsigned_long,_idx2::chunk_cache> *Ht)

{
  long lVar1;
  long lVar2;
  chunk_cache *Key;
  hash_table<unsigned_long,_idx2::chunk_cache> *Ht_00;
  long lVar3;
  chunk_cache *in_R8;
  long lVar4;
  hash_table<unsigned_long,_idx2::chunk_cache> NewHt;
  hash_table<unsigned_long,_idx2::chunk_cache> hStack_78;
  iterator local_40;
  
  hStack_78.Keys = (unsigned_long *)0x0;
  hStack_78.LogCapacity = 0;
  hStack_78.Alloc = (allocator *)0x0;
  hStack_78.Vals = (chunk_cache *)0x0;
  hStack_78.Stats = (bucket_status *)0x0;
  hStack_78.Size = 0;
  Init<unsigned_long,idx2::chunk_cache>(&hStack_78,Ht->LogCapacity + 1,Ht->Alloc);
  lVar2 = 1L << ((byte)Ht->LogCapacity & 0x3f);
  if (Ht->LogCapacity == 0x3f) {
    lVar4 = -0x8000000000000000;
LAB_00195720:
    if (lVar4 != lVar2) {
      Key = Ht->Vals + lVar4;
      Ht_00 = (hash_table<unsigned_long,_idx2::chunk_cache> *)(Ht->Keys + lVar4);
      do {
        Insert<unsigned_long,idx2::chunk_cache>
                  (&local_40,(idx2 *)&hStack_78,Ht_00,(unsigned_long *)Key,in_R8);
        lVar2 = lVar4 * -0xa0;
        lVar3 = lVar4 * -8;
        do {
          lVar2 = lVar2 + -0xa0;
          lVar3 = lVar3 + -8;
          lVar1 = lVar4 + 1;
          lVar4 = lVar4 + 1;
        } while (Ht->Stats[lVar1] != Occupied);
        Ht_00 = (hash_table<unsigned_long,_idx2::chunk_cache> *)((long)Ht->Keys - lVar3);
        Key = (chunk_cache *)((long)Ht->Vals - lVar2);
      } while (1L << ((byte)Ht->LogCapacity & 0x3f) != lVar4);
    }
  }
  else {
    lVar4 = 0;
    lVar3 = 0;
    if (0 < lVar2) {
      lVar3 = lVar2;
    }
    do {
      if (Ht->Stats[lVar4] == Occupied) goto LAB_00195720;
      lVar4 = lVar4 + 1;
    } while (lVar3 + 1 != lVar4);
  }
  Dealloc<unsigned_long,idx2::chunk_cache>(Ht);
  Ht->Stats = hStack_78.Stats;
  Ht->Size = hStack_78.Size;
  Ht->LogCapacity = hStack_78.LogCapacity;
  Ht->Alloc = hStack_78.Alloc;
  Ht->Keys = hStack_78.Keys;
  Ht->Vals = hStack_78.Vals;
  Ht->Stats = hStack_78.Stats;
  Ht->Size = hStack_78.Size;
  return;
}

Assistant:

void
IncreaseCapacity(hash_table<k, v>* Ht)
{
  hash_table<k, v> NewHt;
  Init(&NewHt, Ht->LogCapacity + 1, Ht->Alloc);
  for (auto It = Begin(*Ht); It != End(*Ht); ++It)
    Insert(&NewHt, *(It.Key), *(It.Val));
  Dealloc(Ht);
  *Ht = NewHt;
}